

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_SyntaxEditions_Test::
~ParseEditionsTest_SyntaxEditions_Test(ParseEditionsTest_SyntaxEditions_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, SyntaxEditions) {
  ExpectHasEarlyExitErrors(
      R"schema(
        syntax = "editions";
        message A {
          optional int32 b = 1;
        })schema",
      "1:17: Unrecognized syntax identifier \"editions\".  This parser only "
      "recognizes \"proto2\" and \"proto3\".\n");
}